

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

address __thiscall
pstore::index::
hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
::store_leaf_node<std::pair<pstore::indirect_string,pstore::index::details::empty_class>>
          (hamt_map<pstore::indirect_string,pstore::index::details::empty_class,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
           *this,transaction_base *transaction,
          pair<pstore::indirect_string,_pstore::index::details::empty_class> *v,
          not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  index_pointer iVar1;
  index_pointer local_38;
  transaction_base *local_30;
  undefined8 local_28;
  undefined1 local_20;
  
  (*transaction->_vptr_transaction_base[2])(transaction,0,4);
  local_28 = 0;
  local_20 = 0;
  local_38.internal_ = (internal_node *)&PTR__writer_base_00138c80;
  local_30 = transaction;
  iVar1.addr_.a_ =
       serialize::
       serializer<std::pair<pstore::indirect_string,_pstore::index::details::empty_class>,_void>::
       write<pstore::serialize::archive::database_writer>((database_writer *)&local_38.addr_,v);
  if (((ulong)iVar1.internal_ & 3) == 0) {
    local_30 = (transaction_base *)0xffffffffffffffff;
    local_38.addr_.a_ = iVar1.addr_.a_;
    array_stack<pstore::index::details::parent_type,_13UL>::push
              (parents.ptr_,(value_type *)&local_38.addr_);
    return (address)iVar1.internal_;
  }
  assert_failed("(result.absolute () & (aligned_to - 1U)) == 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x2d5);
}

Assistant:

address hamt_map<KeyType, ValueType, Hash, KeyEqual>::store_leaf_node (
            transaction_base & transaction, OtherValueType const & v,
            gsl::not_null<parent_stack *> const parents) {

            // Make sure the alignment of leaf node is 4 to ensure that the two LSB are guaranteed
            // 0. If 'v' has greater alignment, serialize::write() will add additional padding.
            constexpr auto aligned_to = std::size_t{4};
            static_assert ((details::internal_node_bit | details::heap_node_bit) == aligned_to - 1,
                           "expected required alignment to be 4");
            transaction.allocate (0, aligned_to);

            // Now write the node and return where it went.
            address const result =
                serialize::write (serialize::archive::make_writer (transaction), v);
            PSTORE_ASSERT ((result.absolute () & (aligned_to - 1U)) == 0U);
            parents->push (details::parent_type{index_pointer{result}});

            return result;
        }